

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O2

C_File * C_new_file(C_Parser *tokenizer,char *name,int file_no,char *contents)

{
  C_File *pCVar1;
  
  pCVar1 = (C_File *)
           (*tokenizer->memory_allocator->calloc)(tokenizer->memory_allocator->arena,1,0x28);
  pCVar1->name = name;
  pCVar1->display_name = name;
  pCVar1->file_no = file_no;
  pCVar1->contents = contents;
  return pCVar1;
}

Assistant:

C_File *C_new_file(C_Parser *tokenizer, char *name, int file_no, char *contents) {
  C_File *file = tokenizer->memory_allocator->calloc(tokenizer->memory_allocator->arena, 1, sizeof(C_File));
  file->name = name;
  file->display_name = name;
  file->file_no = file_no;
  file->contents = contents;
  return file;
}